

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_string_sort(void)

{
  uint uVar1;
  time_t tVar2;
  char *file;
  char *pcVar3;
  void *unaff_retaddr;
  void *in_stack_00000010;
  char *tmp;
  char **test_strings;
  uint size;
  uint j;
  uint i;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  wchar_t in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  wchar_t line;
  uint in_stack_fffffffffffffff8;
  uint uVar4;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  line = L'\x1c';
  file = (char *)calloc(1,0xe0);
  assertion_assert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  for (uVar4 = 0; uVar4 < (uint)(line + L'\xffffffff'); uVar4 = uVar4 + 1) {
    pcVar3 = strdup(strings[uVar4]);
    *(char **)(file + (ulong)uVar4 * 8) = pcVar3;
    assertion_assert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  }
  for (uVar4 = 0; uVar4 < (uint)(line + L'\xffffffff'); uVar4 = uVar4 + 1) {
    uVar1 = rand();
    in_stack_fffffffffffffff8 = uVar4 + uVar1 % (uint)((line + L'\xffffffff') - uVar4);
    in_stack_ffffffffffffffe0 = *(char **)(file + (ulong)uVar4 * 8);
    *(undefined8 *)(file + (ulong)uVar4 * 8) =
         *(undefined8 *)(file + (ulong)in_stack_fffffffffffffff8 * 8);
    *(char **)(file + (ulong)in_stack_fffffffffffffff8 * 8) = in_stack_ffffffffffffffe0;
  }
  archive_utility_string_sort
            ((char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  assertion_equal_int(file,(wchar_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0,
                      (char *)0x139f67,unaff_retaddr);
  for (uVar4 = 0; uVar4 < (uint)(line + L'\xffffffff'); uVar4 = uVar4 + 1) {
    assertion_equal_string
              ((char *)CONCAT44(uVar4,in_stack_fffffffffffffff8),line,file,in_stack_ffffffffffffffe0
               ,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),in_stack_00000010,(wchar_t)tmp);
  }
  for (uVar4 = 0; uVar4 < (uint)(line + L'\xffffffff'); uVar4 = uVar4 + 1) {
    free(*(void **)(file + (ulong)uVar4 * 8));
  }
  free(file);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_sort)
{
  unsigned int i, j, size;
  char **test_strings, *tmp;

  srand(time(NULL));
  size = sizeof(strings) / sizeof(char *);
  assert((test_strings = (char **)calloc(1, sizeof(strings))) != NULL);
  for (i = 0; i < (size - 1); i++)
    assert((test_strings[i] = strdup(strings[i])) != NULL);

  /* Shuffle the test strings */
  for (i = 0; i < (size - 1); i++)
  {
    j = rand() % ((size - 1) - i);
    j += i;
    tmp = test_strings[i];
    test_strings[i] = test_strings[j];
    test_strings[j] = tmp;
  }

  /* Sort and test */
  assertEqualInt(ARCHIVE_OK, archive_utility_string_sort(test_strings));
  for (i = 0; i < (size - 1); i++)
    assertEqualString(test_strings[i], strings[i]);

  for (i = 0; i < (size - 1); i++)
    free(test_strings[i]);
  free(test_strings);
}